

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

Vec_Ptr_t * collectBarrierDisjunctions(Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers)

{
  int nCap;
  int iVar1;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vNewBarrierSignals;
  Aig_Obj_t *pObjTargetPoOld;
  Aig_Obj_t *pObjCurr;
  Aig_Obj_t *pObjBarrier;
  Vec_Int_t *vIthBarrier;
  int jElem;
  int j;
  int i;
  int barrierCount;
  Vec_Ptr_t *vBarriers_local;
  Aig_Man_t *pAigNew_local;
  Aig_Man_t *pAigOld_local;
  
  if (vBarriers == (Vec_Ptr_t *)0x0) {
    pAigOld_local = (Aig_Man_t *)0x0;
  }
  else {
    nCap = Vec_PtrSize(vBarriers);
    if (nCap < 1) {
      pAigOld_local = (Aig_Man_t *)0x0;
    }
    else {
      pAigOld_local = (Aig_Man_t *)Vec_PtrAlloc(nCap);
      for (jElem = 0; jElem < nCap; jElem = jElem + 1) {
        p = (Vec_Int_t *)Vec_PtrEntry(vBarriers,jElem);
        iVar1 = Vec_IntSize(p);
        if (iVar1 < 1) {
          __assert_fail("Vec_IntSize( vIthBarrier ) >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                        ,0x8e,
                        "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        pAVar2 = Aig_ManConst1(pAigNew);
        pObjCurr = Aig_Not(pAVar2);
        for (vIthBarrier._4_4_ = 0; iVar1 = Vec_IntSize(p), vIthBarrier._4_4_ < iVar1;
            vIthBarrier._4_4_ = vIthBarrier._4_4_ + 1) {
          iVar1 = Vec_IntEntry(p,vIthBarrier._4_4_);
          pAVar2 = Aig_ManCo(pAigOld,iVar1);
          pAVar2 = driverToPoNew(pAigOld,pAVar2);
          pObjCurr = Aig_Or(pAigNew,pAVar2,pObjCurr);
        }
        if (pObjCurr == (Aig_Obj_t *)0x0) {
          __assert_fail("pObjBarrier",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                        ,0x98,
                        "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        Vec_PtrPush((Vec_Ptr_t *)pAigOld_local,pObjCurr);
      }
      iVar1 = Vec_PtrSize((Vec_Ptr_t *)pAigOld_local);
      if (iVar1 != nCap) {
        __assert_fail("Vec_PtrSize( vNewBarrierSignals ) == barrierCount",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                      ,0x9b,
                      "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                     );
      }
    }
  }
  return (Vec_Ptr_t *)pAigOld_local;
}

Assistant:

Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *pAigOld, Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers)
{
	int barrierCount, i, j, jElem;
	Vec_Int_t *vIthBarrier;
	Aig_Obj_t *pObjBarrier, *pObjCurr, *pObjTargetPoOld;
	Vec_Ptr_t *vNewBarrierSignals;

	if( vBarriers == NULL )
		return NULL;
	barrierCount = Vec_PtrSize( vBarriers );
	if( barrierCount <= 0 )
		return NULL;

	vNewBarrierSignals = Vec_PtrAlloc( barrierCount );

	for( i=0; i<barrierCount; i++ )
	{
		vIthBarrier = (Vec_Int_t *)Vec_PtrEntry( vBarriers, i );
		assert( Vec_IntSize( vIthBarrier ) >= 1 );
		pObjBarrier = Aig_Not(Aig_ManConst1(pAigNew));
		Vec_IntForEachEntry( vIthBarrier, jElem, j )
		{
			pObjTargetPoOld = Aig_ManCo( pAigOld, jElem );
			//Aig_ObjPrint( pAigOld, pObjTargetPoOld );
			//printf("\n");
			pObjCurr = driverToPoNew( pAigOld, pObjTargetPoOld );
			pObjBarrier = Aig_Or( pAigNew, pObjCurr, pObjBarrier );
		}
		assert( pObjBarrier );
		Vec_PtrPush(vNewBarrierSignals, pObjBarrier);
	}
	assert( Vec_PtrSize( vNewBarrierSignals ) == barrierCount );

	return vNewBarrierSignals;
}